

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

float deqp::gles2::Performance::vectorFloatRelativeStandardDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  pointer plVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = vectorFloatStandardDeviation<long>
                    ((Performance *)
                     (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (vector<long,_std::allocator<long>_> *)
                     (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  plVar1 = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_finish - (long)plVar1 >> 3;
  uVar2 = (uint)uVar3;
  if ((int)uVar2 < 1) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = 0.0;
    uVar4 = 0;
    do {
      fVar6 = fVar6 + (float)plVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar4);
  }
  fVar6 = fVar6 / (float)uVar3;
  return (float)(~-(uint)(fVar6 == 0.0) & (uint)(fVar5 / fVar6));
}

Assistant:

static float vectorFloatRelativeStandardDeviation (const vector<T>& v)
{
	return hackySafeRelativeResult(vectorFloatStandardDeviation(v), vectorFloatAverage(v));
}